

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O2

void __thiscall
TPZNonLinMultGridAnalysis::CoutTime(TPZNonLinMultGridAnalysis *this,clock_t *start,char *title)

{
  long lVar1;
  clock_t cVar2;
  ostream *poVar3;
  
  cVar2 = clock();
  poVar3 = std::operator<<((ostream *)&std::cout,title);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar1 = *start;
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar3 = std::operator<<(poVar3," segundos");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::ostream::_M_insert<double>((double)((cVar2 - lVar1) / 1000000) / 60.0);
  poVar3 = std::operator<<(poVar3," minutos");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::CoutTime(clock_t &start,const char *title){
    clock_t end = clock();
    cout << title <<  endl;
    clock_t segundos = ((end - start)/CLOCKS_PER_SEC);
    cout << segundos << " segundos" << endl;
    cout << segundos/60.0 << " minutos" << endl << endl;
}